

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O2

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatInvalidInputTest_::
InvalidSubMessage<proto2_unittest::TestAllTypes>::TestBody
          (InvalidSubMessage<proto2_unittest::TestAllTypes> *this)

{
  bool bVar1;
  char *in_R9;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  string_view data_03;
  AssertHelper local_390;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_388;
  string local_380;
  AssertionResult gtest_ar_;
  TestAllTypes message;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&message);
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_380,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,
             anon_var_dwarf_651463 + 5,0);
  data._M_str = local_380._M_dataplus._M_p;
  data._M_len = local_380._M_string_length;
  gtest_ar_.success_ = MessageLite::ParseFromString((MessageLite *)&message,data);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&local_380);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_380,(internal *)&gtest_ar_,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\", 0))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x55b,local_380._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    std::__cxx11::string::~string((string *)&local_380);
    if (local_388._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_388._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_380,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,"",1)
  ;
  data_00._M_str = local_380._M_dataplus._M_p;
  data_00._M_len = local_380._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&message,data_00);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&local_380);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_380,(internal *)&gtest_ar_,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\0\", 1))","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x55f,local_380._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    std::__cxx11::string::~string((string *)&local_380);
    if (local_388._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_388._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_380,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,
             anon_var_dwarf_536a45,1);
  data_01._M_str = local_380._M_dataplus._M_p;
  data_01._M_len = local_380._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&message,data_01);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&local_380);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_380,(internal *)&gtest_ar_,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\200\", 1))","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x563,local_380._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    std::__cxx11::string::~string((string *)&local_380);
    if (local_388._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_388._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_380,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,"\f",
             1);
  data_02._M_str = local_380._M_dataplus._M_p;
  data_02._M_len = local_380._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&message,data_02);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&local_380);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_380,(internal *)&gtest_ar_,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\014\", 1))","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x567,local_380._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    std::__cxx11::string::~string((string *)&local_380);
    if (local_388._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_388._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_380,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,
             "\x0f",1);
  data_03._M_str = local_380._M_dataplus._M_p;
  data_03._M_len = local_380._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&message,data_03);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&local_380);
  if (bVar1) {
    testing::Message::Message((Message *)&local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_380,(internal *)&gtest_ar_,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\017\", 1))","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x56b,local_380._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    std::__cxx11::string::~string((string *)&local_380);
    if (local_388._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_388._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  proto2_unittest::TestAllTypes::~TestAllTypes(&message);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatInvalidInputTest, InvalidSubMessage) {
  typename TestFixture::TestAllTypes message;

  // Control case.
  EXPECT_TRUE(message.ParseFromString(this->MakeInvalidEmbeddedMessage("", 0)));

  // The byte is a valid varint, but not a valid tag (zero).
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\0", 1)));

  // The byte is a malformed varint.
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\200", 1)));

  // The byte is an endgroup tag, but we aren't parsing a group.
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\014", 1)));

  // The byte is a valid varint but not a valid tag (bad wire type).
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\017", 1)));
}